

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

char * ptls_hexdump(char *buf,void *_src,size_t len)

{
  char *pcVar1;
  size_t i;
  uint8_t *src;
  char *dst;
  size_t len_local;
  void *_src_local;
  char *buf_local;
  
  dst = buf;
  for (i = 0; i != len; i = i + 1) {
    pcVar1 = dst + 1;
    *dst = "0123456789abcdef"[(int)(uint)*(byte *)((long)_src + i) >> 4];
    dst = dst + 2;
    *pcVar1 = "0123456789abcdef"[(int)(*(byte *)((long)_src + i) & 0xf)];
  }
  *dst = '\0';
  return buf;
}

Assistant:

char *ptls_hexdump(char *buf, const void *_src, size_t len)
{
    char *dst = buf;
    const uint8_t *src = _src;
    size_t i;

    for (i = 0; i != len; ++i) {
        *dst++ = "0123456789abcdef"[src[i] >> 4];
        *dst++ = "0123456789abcdef"[src[i] & 0xf];
    }
    *dst++ = '\0';
    return buf;
}